

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyBinaryStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  byte bVar1;
  uint uVar2;
  ushort **ppuVar3;
  ushort *puVar5;
  int iVar6;
  ushort *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  bool bVar10;
  ushort *puVar4;
  
  puVar9 = (ushort *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar3 = __ctype_b_loc();
    do {
      bVar1 = (byte)*(ushort *)zSrc;
      if ((*(byte *)((long)*ppuVar3 + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) {
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          bVar10 = bVar1 == 0x2d;
          zSrc = (char *)((long)zSrc + 1);
          goto LAB_0011bd12;
        }
        break;
      }
      zSrc = (char *)((long)zSrc + 1);
    } while (zSrc < puVar9);
  }
  bVar10 = false;
LAB_0011bd12:
  puVar4 = puVar9 + -1;
  if (((zSrc < puVar4) && ((byte)*(ushort *)zSrc == 0x30)) &&
     (uVar2 = *(byte *)((long)zSrc + 1) | 0x20, puVar4 = (ushort *)(ulong)uVar2, uVar2 == 0x62)) {
    zSrc = (char *)((long)zSrc + 2);
  }
  for (; (zSrc < puVar9 && ((byte)*(ushort *)zSrc == 0x30)); zSrc = (char *)((long)zSrc + 1)) {
  }
  if (zSrc < puVar9) {
    iVar6 = 3;
    puVar8 = (ushort *)0x0;
    puVar4 = (ushort *)((long)zSrc + 3);
    do {
      puVar5 = puVar4;
      if ((*(byte *)((long)puVar5 + -3) & 0xfe) != 0x30) {
        puVar7 = (ushort *)((long)puVar5 - 3);
        puVar4 = puVar7;
        goto LAB_0011be18;
      }
      puVar8 = (ushort *)(((ulong)*(byte *)((long)puVar5 + -3) + (long)puVar8 * 2) - 0x30);
      puVar7 = puVar5 + -1;
      puVar4 = puVar5;
      if (puVar9 <= puVar7) {
        puVar7 = (ushort *)((long)zSrc + 1);
        goto LAB_0011be18;
      }
      if (((byte)*puVar7 & 0xfe) != 0x30) goto LAB_0011be18;
      puVar8 = (ushort *)(((ulong)(byte)*puVar7 + (long)puVar8 * 2) - 0x30);
      puVar7 = (ushort *)((long)puVar5 - 1);
      if (puVar9 <= puVar7) goto LAB_0011be18;
      if (((byte)*puVar7 & 0xfe) != 0x30) {
        puVar7 = (ushort *)((long)zSrc + 2);
        goto LAB_0011be18;
      }
      puVar8 = (ushort *)(((ulong)(byte)*puVar7 + (long)puVar8 * 2) - 0x30);
      if (puVar9 <= puVar5) {
        puVar7 = (ushort *)((long)zSrc + 3);
        goto LAB_0011be18;
      }
      puVar7 = puVar5;
      if ((0x3e < iVar6) || (((byte)*puVar5 & 0xfe) != 0x30)) goto LAB_0011be18;
      puVar8 = (ushort *)(((ulong)(byte)*puVar5 + (long)puVar8 * 2) - 0x30);
      zSrc = (char *)((long)zSrc + 4);
      puVar4 = puVar5 + 2;
      iVar6 = iVar6 + 4;
    } while ((ushort *)((long)puVar5 + 1) < puVar9);
    puVar7 = (ushort *)((long)puVar5 + 1);
  }
  else {
    puVar8 = (ushort *)0x0;
    puVar7 = (ushort *)zSrc;
  }
LAB_0011be18:
  if (puVar7 < puVar9) {
    ppuVar3 = __ctype_b_loc();
    puVar4 = *ppuVar3;
    bVar1 = *(byte *)((long)puVar4 + (long)(char)(byte)*puVar7 * 2 + 1);
    while (((bVar1 & 0x20) != 0 && (puVar7 = (ushort *)((long)puVar7 + 1), puVar7 < puVar9))) {
      bVar1 = *(byte *)((long)puVar4 + (long)(char)*(byte *)puVar7 * 2 + 1);
    }
  }
  if (pOutVal != (void *)0x0) {
    puVar4 = (ushort *)-(long)puVar8;
    if (puVar8 == (ushort *)0x0) {
      puVar4 = puVar8;
    }
    if (!bVar10) {
      puVar4 = puVar8;
    }
    *(ushort **)pOutVal = puVar4;
  }
  return (sxi32)puVar4;
}

Assistant:

JX9_PRIVATE sxi32 SyBinaryStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	if( zSrc < &zEnd[-2] && zSrc[0] == '0' && (zSrc[1] == 'b' || zSrc[1] == 'B') ){
		/* Bypass binary prefix */
		zSrc += sizeof(char) * 2;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
		if(zSrc >= zEnd || (zSrc[0] != '1' && zSrc[0] != '0') || (int)(zSrc-zIn) > 62){ break; } c = zSrc[0] - '0'; nVal = (nVal << 1) + c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}